

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O3

int Ssw_SmlCountEqual(Ssw_Sml_t *p,Aig_Obj_t *pObjLi,Aig_Obj_t *pObjLo)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  
  if ((pObjLo->field_0x18 & 8) == 0) {
    iVar1 = p->nWordsTotal;
    lVar4 = (long)p->nWordsPref;
    iVar3 = 0;
    if (p->nWordsPref < iVar1) {
      iVar3 = 0;
      do {
        uVar2 = ~(*(uint *)((long)&p[1].pAig + lVar4 * 4 + (long)(pObjLi->Id * iVar1) * 4) ^
                 *(uint *)((long)&p[1].pAig + lVar4 * 4 + (long)(pObjLo->Id * iVar1) * 4));
        uVar2 = (uVar2 >> 1 & 0x55555555) + (uVar2 & 0x55555555);
        uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
        uVar2 = (uVar2 >> 4 & 0x7070707) + (uVar2 & 0x7070707);
        uVar2 = (uVar2 >> 8 & 0xf000f) + (uVar2 & 0xf000f);
        iVar3 = (uVar2 >> 0x10) + iVar3 + (uVar2 & 0xffff);
        lVar4 = lVar4 + 1;
      } while (iVar1 != lVar4);
    }
    return iVar3;
  }
  __assert_fail("pObjLo->fPhase == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                ,0x112,"int Ssw_SmlCountEqual(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

int Ssw_SmlCountEqual( Ssw_Sml_t * p, Aig_Obj_t * pObjLi, Aig_Obj_t * pObjLo )
{
    unsigned * pSimLi, * pSimLo;
    int k, Counter = 0;
    assert( pObjLo->fPhase == 0 );
    // pObjLi->fPhase may be 1, but the LI simulation data is not complemented!
    pSimLi   = Ssw_ObjSim( p, pObjLi->Id );
    pSimLo   = Ssw_ObjSim( p, pObjLo->Id );
    for ( k = p->nWordsPref; k < p->nWordsTotal; k++ )
        Counter += Aig_WordCountOnes( ~(pSimLi[k] ^ pSimLo[k]) );
    return Counter;
}